

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

void QCoreApplication::removeLibraryPath(QString *path)

{
  bool bVar1;
  Type *pTVar2;
  QDir *in_RDI;
  long in_FS_OFFSET;
  QStringList *app_libpaths;
  QStringList *libpaths;
  QCoreApplicationData *d;
  QString canonicalPath;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffff58;
  QMutexLocker<QRecursiveMutex> *in_stack_ffffffffffffff60;
  Type *pTVar3;
  CaseSensitivity cs;
  QString *str;
  QDir *in_stack_ffffffffffffff80;
  QString *in_stack_ffffffffffffff98;
  QString local_40;
  undefined1 *local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x343eeb);
  if (bVar1) goto LAB_003440fb;
  local_40.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  str = &local_40;
  QDir::QDir(in_RDI,in_stack_ffffffffffffff98);
  QDir::canonicalPath(in_stack_ffffffffffffff80);
  QDir::~QDir((QDir *)0x343f43);
  bVar1 = QString::isEmpty((QString *)0x343f4d);
  if (!bVar1) {
    pTVar2 = QGlobalStatic::operator_cast_to_QCoreApplicationData_
                       ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>
                         *)in_stack_ffffffffffffff58);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pTVar3 = pTVar2;
    QMutexLocker<QRecursiveMutex>::QMutexLocker(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
    ;
    cs = (CaseSensitivity)((ulong)pTVar3 >> 0x20);
    bVar1 = QCoreApplicationData::libPathsManuallySet((QCoreApplicationData *)0x343fef);
    if (bVar1) {
      in_stack_ffffffffffffff60 =
           (QMutexLocker<QRecursiveMutex> *)
           QList<QString>::removeAll<QString>
                     ((QList<QString> *)in_stack_ffffffffffffff60,
                      (QString *)in_stack_ffffffffffffff58);
      if (in_stack_ffffffffffffff60 != (QMutexLocker<QRecursiveMutex> *)0x0) goto LAB_003440c8;
    }
    else {
      libraryPathsLocked();
      QList<QString>::~QList((QList<QString> *)0x344076);
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)&pTVar2->app_libpaths,str,cs);
      if (bVar1) {
        QList<QString>::operator=
                  ((QList<QString> *)in_stack_ffffffffffffff60,
                   (QList<QString> *)in_stack_ffffffffffffff58);
        QList<QString>::removeAll<QString>
                  ((QList<QString> *)in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58)
        ;
LAB_003440c8:
        QMutexLocker<QRecursiveMutex>::unlock(in_stack_ffffffffffffff60);
        QFactoryLoader::refreshAll();
      }
    }
    QMutexLocker<QRecursiveMutex>::~QMutexLocker(in_stack_ffffffffffffff60);
  }
  QString::~QString((QString *)0x3440fb);
LAB_003440fb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCoreApplication::removeLibraryPath(const QString &path)
{
    if (path.isEmpty())
        return;

    QString canonicalPath = QDir(path).canonicalPath();
    if (canonicalPath.isEmpty())
        return;

    QCoreApplicationData *d = coreappdata;
    QMutexLocker locker(&d->libraryPathMutex);

    QStringList *libpaths = &d->manual_libpaths;
    if (d->libPathsManuallySet()) {
        if (libpaths->removeAll(canonicalPath) == 0)
            return;
    } else {
        // make sure that library paths is initialized
        libraryPathsLocked();
        QStringList *app_libpaths = &d->app_libpaths;
        if (!app_libpaths->contains(canonicalPath))
            return;

        *libpaths = *app_libpaths;
        libpaths->removeAll(canonicalPath);
        Q_ASSERT(d->libPathsManuallySet());
    }

    locker.unlock();
    QFactoryLoader::refreshAll();
}